

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *pEVar1;
  Vdbe *p;
  ExprList *pEVar2;
  byte bVar3;
  int iVar4;
  int p1;
  int iVar5;
  int addr;
  int iVar6;
  byte *zP4;
  Select *pSVar7;
  int *piVar8;
  Expr *pEVar9;
  CollSeq *zP4_00;
  u8 uVar10;
  Op *pOVar11;
  uint uVar12;
  int *piVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  ExprList_item *pEVar17;
  int iTab;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_74;
  Expr *local_70;
  int *local_68;
  int local_5c;
  byte *local_58;
  Expr *local_50;
  int local_48;
  int local_44;
  Parse *local_40;
  int local_38;
  int local_34;
  
  local_44 = 0;
  local_74 = 0;
  pEVar9 = pExpr->pLeft;
  iVar4 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar4 != 0) {
    return;
  }
  zP4 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar1 = pExpr->pLeft;
  uVar10 = pEVar1->op;
  if (uVar10 == 0xa8) {
    uVar10 = pEVar1->op2;
  }
  if (uVar10 == 0x83) {
    pSVar7 = (pEVar1->x).pSelect;
LAB_0016c8b2:
    uVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar7->pEList)->pList->nExpr;
  }
  else {
    uVar12 = 1;
    if (uVar10 == 0xa9) {
      pSVar7 = (Select *)&pEVar1->x;
      goto LAB_0016c8b2;
    }
  }
  piVar8 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar12 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_0016cf86;
  piVar15 = (int *)(ulong)uVar12;
  p = pParse->pVdbe;
  piVar13 = &local_44;
  if (destIfFalse == destIfNull) {
    piVar13 = (int *)0x0;
  }
  local_70 = pExpr;
  local_68 = piVar8;
  local_58 = zP4;
  iVar4 = sqlite3FindInIndex(pParse,pExpr,3,piVar13,piVar8,&local_74);
  local_50 = pEVar9;
  local_5c = exprCodeVector(pParse,pEVar9,&local_34);
  zP4 = local_58;
  piVar8 = (int *)0x0;
  if (0 < (int)uVar12) {
    piVar13 = (int *)0x0;
    do {
      piVar8 = piVar13;
      if (piVar13 != (int *)(ulong)(uint)local_68[(long)piVar13]) break;
      piVar13 = (int *)((long)piVar13 + 1);
      piVar8 = piVar15;
    } while (piVar15 != piVar13);
  }
  p1 = local_5c;
  if (((uint)piVar8 != uVar12) &&
     (p1 = sqlite3GetTempRange(pParse,uVar12), iVar5 = local_5c, piVar8 = local_68, 0 < (int)uVar12)
     ) {
    piVar13 = (int *)0x0;
    local_40 = pParse;
    do {
      sqlite3VdbeAddOp3(p,0x4e,(int)piVar13 + iVar5,piVar8[(long)piVar13] + p1,0);
      piVar13 = (int *)((long)piVar13 + 1);
      pParse = local_40;
      zP4 = local_58;
    } while (piVar15 != piVar13);
  }
  if (iVar4 == 5) {
    pEVar2 = (local_70->x).pList;
    local_70 = (Expr *)sqlite3ExprCollSeq(pParse,local_70->pLeft);
    iVar5 = pParse->nLabel + -1;
    iVar4 = 0;
    local_50 = (Expr *)CONCAT44(local_50._4_4_,iVar5);
    pParse->nLabel = iVar5;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar4 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p,0x60,p1,p1,iVar4);
    }
    if (0 < pEVar2->nExpr) {
      pEVar17 = pEVar2->a;
      lVar16 = 0;
      do {
        iVar5 = sqlite3ExprCodeTemp(pParse,pEVar17->pExpr,&local_38);
        if ((iVar4 != 0) && (iVar6 = sqlite3ExprCanBeNull(pEVar17->pExpr), iVar6 != 0)) {
          sqlite3VdbeAddOp3(p,0x60,iVar4,iVar5,iVar4);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar2->nExpr + -1 <= lVar16)) {
          iVar5 = sqlite3VdbeAddOp3(p,0x34,p1,destIfFalse,iVar5);
          sqlite3VdbeChangeP4(p,iVar5,(char *)local_70,-2);
          uVar12 = p->nOp;
          if (0 < (int)uVar12) {
            bVar3 = *local_58 | 0x10;
LAB_0016ce98:
            p->aOp[(ulong)uVar12 - 1].p5 = (short)(char)bVar3;
          }
        }
        else {
          iVar5 = sqlite3VdbeAddOp3(p,0x35,p1,(int)local_50,iVar5);
          sqlite3VdbeChangeP4(p,iVar5,(char *)local_70,-2);
          uVar12 = p->nOp;
          if (0 < (int)uVar12) {
            bVar3 = *local_58;
            goto LAB_0016ce98;
          }
        }
        if (local_38 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = local_38;
          }
        }
        lVar16 = lVar16 + 1;
        pEVar17 = pEVar17 + 1;
      } while (lVar16 < pEVar2->nExpr);
    }
    if (iVar4 == 0) {
      sqlite3VdbeResolveLabel(p,(int)local_50);
      zP4 = local_58;
    }
    else {
      sqlite3VdbeAddOp3(p,0x32,iVar4,destIfNull,0);
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
      sqlite3VdbeResolveLabel(p,(int)local_50);
      bVar3 = pParse->nTempReg;
      zP4 = local_58;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
  }
  else {
    iVar5 = destIfFalse;
    iVar6 = 0;
    if (destIfFalse != destIfNull) {
      iVar5 = pParse->nLabel + -1;
      pParse->nLabel = iVar5;
      iVar6 = iVar5;
    }
    local_40 = (Parse *)CONCAT44(local_40._4_4_,iVar6);
    if (0 < (int)uVar12) {
      uVar14 = 0;
      do {
        pEVar9 = sqlite3VectorFieldSubexpr(local_70->pLeft,uVar14);
        iVar6 = sqlite3ExprCanBeNull(pEVar9);
        if (iVar6 != 0) {
          sqlite3VdbeAddOp3(p,0x32,p1 + uVar14,iVar5,0);
        }
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    if (iVar4 == 1) {
      sqlite3VdbeAddOp3(p,0x1e,local_74,destIfFalse,p1);
      local_48 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    }
    else {
      iVar4 = sqlite3VdbeAddOp3(p,0x5b,p1,uVar12,0);
      sqlite3VdbeChangeP4(p,iVar4,(char *)zP4,uVar12);
      if (destIfFalse == destIfNull) {
        iVar4 = sqlite3VdbeAddOp3(p,0x1c,local_74,destIfFalse,p1);
        if (p->db->mallocFailed == '\0') {
          pOVar11 = p->aOp;
          pOVar11[iVar4].p4type = -3;
          pOVar11[iVar4].p4.i = uVar12;
        }
        goto LAB_0016cf5c;
      }
      local_48 = sqlite3VdbeAddOp3(p,0x1d,local_74,0,p1);
      if (p->db->mallocFailed == '\0') {
        pOVar11 = p->aOp;
        pOVar11[local_48].p4type = -3;
        pOVar11[local_48].p4.i = uVar12;
      }
    }
    if (uVar12 == 1 && local_44 != 0) {
      sqlite3VdbeAddOp3(p,0x33,local_44,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    if ((int)local_40 != 0) {
      sqlite3VdbeResolveLabel(p,(int)local_40);
    }
    local_70 = (Expr *)CONCAT44(local_70._4_4_,local_74);
    iVar5 = sqlite3VdbeAddOp3(p,0x24,local_74,destIfFalse,0);
    iVar4 = destIfFalse;
    if (1 < (int)uVar12) {
      iVar4 = pParse->nLabel + -1;
      pParse->nLabel = iVar4;
    }
    if (0 < (int)uVar12) {
      uVar14 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar6 = pParse->nMem + 1;
          pParse->nMem = iVar6;
        }
        else {
          bVar3 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar3;
          iVar6 = pParse->aTempReg[bVar3];
        }
        pEVar9 = sqlite3VectorFieldSubexpr(local_50,uVar14);
        zP4_00 = sqlite3ExprCollSeq(pParse,pEVar9);
        sqlite3VdbeAddOp3(p,0x5a,(int)local_70,uVar14,iVar6);
        addr = sqlite3VdbeAddOp3(p,0x34,p1 + uVar14,iVar4,iVar6);
        sqlite3VdbeChangeP4(p,addr,(char *)zP4_00,-2);
        if (iVar6 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = iVar6;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    sqlite3VdbeAddOp3(p,0xb,0,destIfNull,0);
    if (1 < (int)uVar12) {
      sqlite3VdbeResolveLabel(p,iVar4);
      sqlite3VdbeAddOp3(p,5,(int)local_70,iVar5 + 1,0);
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    if (p->db->mallocFailed == '\0') {
      iVar4 = p->nOp + -1;
      if (-1 < local_48) {
        iVar4 = local_48;
      }
      pOVar11 = p->aOp + iVar4;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar11->p2 = p->nOp;
    zP4 = local_58;
  }
LAB_0016cf5c:
  piVar8 = local_68;
  if (p1 != 0 && p1 != local_5c) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = p1;
    }
  }
LAB_0016cf86:
  if (piVar8 != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,piVar8);
  }
  if (zP4 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,zP4);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 
  int iTab = 0;         /* Index to use */

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}